

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsql_sqlite.cpp
# Opt level: O0

bool __thiscall QSQLiteResult::exec(QSQLiteResult *this)

{
  bool bVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  QSQLiteResultPrivate *pQVar5;
  qsizetype qVar6;
  long lVar7;
  const_reference pQVar8;
  ulong uVar9;
  QByteArray *this_00;
  QString *this_01;
  long *in_RDI;
  long in_FS_OFFSET;
  bool bVar10;
  const_iterator cVar11;
  const_iterator cVar12;
  QByteArrayView QVar13;
  QString *str_2;
  QByteArray *ba;
  QVariant *value;
  int i_1;
  QList<int> *indexes;
  int currentIndex;
  int bindParamCount;
  bool paramCountIsValid;
  int paramCount;
  int res;
  QSQLiteResultPrivate *d;
  size_t RuntimeThreshold;
  size_t i_2;
  QString str_3;
  QString str_1;
  QTime time;
  QString str;
  QDateTime dateTime;
  QString placeHolder;
  char *parameterName;
  int i;
  QList<int> handledIndexes;
  QList<QVariant> prunedValues;
  anon_class_1_0_00000001 countIndexes;
  QList<QVariant> values;
  int in_stack_fffffffffffffc48;
  int in_stack_fffffffffffffc4c;
  undefined4 in_stack_fffffffffffffc50;
  undefined2 in_stack_fffffffffffffc54;
  undefined1 in_stack_fffffffffffffc56;
  undefined1 in_stack_fffffffffffffc57;
  sqlite3_stmt *in_stack_fffffffffffffc58;
  QStringView *in_stack_fffffffffffffc60;
  undefined4 in_stack_fffffffffffffc68;
  undefined4 in_stack_fffffffffffffc6c;
  QChar *in_stack_fffffffffffffc70;
  sqlite3_stmt *in_stack_fffffffffffffc78;
  undefined4 in_stack_fffffffffffffc80;
  int in_stack_fffffffffffffc84;
  sqlite3_stmt *in_stack_fffffffffffffce0;
  undefined4 in_stack_fffffffffffffce8;
  int in_stack_fffffffffffffcec;
  QSQLiteResultPrivate *in_stack_fffffffffffffcf0;
  int local_294;
  Data<QHashPrivate::Node<QString,_QList<int>_>_> *local_280;
  size_t local_278;
  Data<QHashPrivate::Node<QString,_QList<int>_>_> *local_270;
  size_t local_268;
  int local_250;
  bool local_231;
  ulong local_210;
  QSqlError local_1f8 [8];
  undefined1 local_1f0 [24];
  undefined1 local_1d8 [24];
  undefined1 local_1c0 [24];
  QSqlError local_1a8 [8];
  char local_1a0 [24];
  QSqlError local_188 [8];
  QString local_180;
  QString local_158;
  undefined4 local_13c;
  QString local_138;
  undefined1 *local_120 [4];
  storage_type_conflict *local_100;
  undefined1 *local_f0;
  undefined1 *local_e8;
  undefined1 *local_e0;
  char *local_d8;
  int local_cc;
  undefined1 *local_c8;
  undefined1 *local_c0;
  undefined1 *local_b8;
  undefined1 *local_b0;
  undefined1 *local_a8;
  undefined1 *local_a0;
  undefined1 local_91;
  char local_90 [24];
  QSqlError local_78 [8];
  undefined1 local_70 [24];
  undefined1 local_58 [24];
  undefined1 local_40 [24];
  QSqlError local_28 [8];
  QList<QVariant> local_20;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar5 = d_func((QSQLiteResult *)0x115d49);
  local_20.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_20.d.ptr = (QVariant *)&DAT_aaaaaaaaaaaaaaaa;
  local_20.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  QSqlResult::boundValues(in_RDI);
  QList<QVariant>::QList
            ((QList<QVariant> *)
             CONCAT17(in_stack_fffffffffffffc57,
                      CONCAT16(in_stack_fffffffffffffc56,
                               CONCAT24(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50))),
             (QList<QVariant> *)CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48));
  pQVar5->skippedStatus = false;
  pQVar5->skipRow = false;
  QSqlRecord::clear();
  QSqlCachedResult::clearValues();
  QString::QString((QString *)0x115de7);
  QString::QString((QString *)0x115df4);
  QString::QString((QString *)0x115e01);
  QSqlError::QSqlError(local_28,(QString *)local_40,(QString *)local_58,NoError,(QString *)local_70)
  ;
  (**(code **)(*in_RDI + 0x28))(in_RDI,local_28);
  QSqlError::~QSqlError(local_28);
  QString::~QString((QString *)0x115e58);
  QString::~QString((QString *)0x115e65);
  QString::~QString((QString *)0x115e72);
  iVar3 = sqlite3_reset((sqlite3_stmt *)in_stack_fffffffffffffc60);
  if (iVar3 == 0) {
    iVar3 = sqlite3_bind_parameter_count(pQVar5->stmt);
    qVar6 = QList<QVariant>::size(&local_20);
    bVar10 = iVar3 == qVar6;
    if ((0 < iVar3) && (qVar6 = QList<QVariant>::size(&local_20), iVar3 < qVar6)) {
      local_91 = 0xaa;
      cVar11 = QHash<QString,_QList<int>_>::cbegin
                         ((QHash<QString,_QList<int>_> *)
                          CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68));
      cVar12 = QHash<QString,_QList<int>_>::cend
                         ((QHash<QString,_QList<int>_> *)in_stack_fffffffffffffc58);
      local_270 = cVar11.i.d;
      local_268 = cVar11.i.bucket;
      local_280 = cVar12.i.d;
      local_278 = cVar12.i.bucket;
      iVar4 = std::
              accumulate<QHash<QString,QList<int>>::const_iterator,int,QSQLiteResult::exec()::__0>
                        (local_270,local_268,local_280,local_278,0);
      qVar6 = QList<QVariant>::size(&local_20);
      bVar10 = iVar4 == qVar6;
      local_b0 = &DAT_aaaaaaaaaaaaaaaa;
      local_a8 = &DAT_aaaaaaaaaaaaaaaa;
      local_a0 = &DAT_aaaaaaaaaaaaaaaa;
      QList<QVariant>::QList((QList<QVariant> *)0x1160db);
      local_c8 = &DAT_aaaaaaaaaaaaaaaa;
      local_c0 = &DAT_aaaaaaaaaaaaaaaa;
      local_b8 = &DAT_aaaaaaaaaaaaaaaa;
      QList<int>::QList((QList<int> *)0x116115);
      for (local_cc = 0; lVar7 = (long)local_cc, qVar6 = QList<QVariant>::size(&local_20),
          lVar7 < qVar6; local_cc = local_cc + 1) {
        bVar1 = QListSpecialMethodsBase<int>::contains<int>
                          ((QListSpecialMethodsBase<int> *)
                           CONCAT17(in_stack_fffffffffffffc57,
                                    CONCAT16(in_stack_fffffffffffffc56,
                                             CONCAT24(in_stack_fffffffffffffc54,
                                                      in_stack_fffffffffffffc50))),
                           (int *)CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48));
        if (!bVar1) {
          local_d8 = sqlite3_bind_parameter_name
                               (in_stack_fffffffffffffc58,
                                CONCAT13(in_stack_fffffffffffffc57,
                                         CONCAT12(in_stack_fffffffffffffc56,
                                                  in_stack_fffffffffffffc54)));
          if (local_d8 == (char *)0x0) {
            bVar10 = false;
          }
          else {
            local_f0 = &DAT_aaaaaaaaaaaaaaaa;
            local_e8 = &DAT_aaaaaaaaaaaaaaaa;
            local_e0 = &DAT_aaaaaaaaaaaaaaaa;
            QByteArrayView::QByteArrayView<const_char_*,_true>
                      ((QByteArrayView *)in_stack_fffffffffffffc60,
                       (char **)in_stack_fffffffffffffc58);
            QVar13.m_data = local_100;
            QVar13.m_size = (qsizetype)&local_f0;
            QString::fromUtf8(QVar13);
            QHash<QString,_QList<int>_>::value
                      ((QHash<QString,_QList<int>_> *)
                       CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68),
                       (QString *)in_stack_fffffffffffffc60);
            QList<int>::operator<<
                      ((QList<int> *)
                       CONCAT17(in_stack_fffffffffffffc57,
                                CONCAT16(in_stack_fffffffffffffc56,
                                         CONCAT24(in_stack_fffffffffffffc54,
                                                  in_stack_fffffffffffffc50))),
                       (QList<int> *)CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48));
            QList<int>::first((QList<int> *)
                              CONCAT17(in_stack_fffffffffffffc57,
                                       CONCAT16(in_stack_fffffffffffffc56,
                                                CONCAT24(in_stack_fffffffffffffc54,
                                                         in_stack_fffffffffffffc50))));
            QList<QVariant>::at((QList<QVariant> *)
                                CONCAT17(in_stack_fffffffffffffc57,
                                         CONCAT16(in_stack_fffffffffffffc56,
                                                  CONCAT24(in_stack_fffffffffffffc54,
                                                           in_stack_fffffffffffffc50))),
                                CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48));
            QList<QVariant>::operator<<
                      ((QList<QVariant> *)
                       CONCAT17(in_stack_fffffffffffffc57,
                                CONCAT16(in_stack_fffffffffffffc56,
                                         CONCAT24(in_stack_fffffffffffffc54,
                                                  in_stack_fffffffffffffc50))),
                       (parameter_type)CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48)
                      );
            QList<int>::~QList((QList<int> *)0x1162bc);
            QString::~QString((QString *)0x1162c9);
          }
        }
      }
      QList<QVariant>::operator=
                ((QList<QVariant> *)
                 CONCAT17(in_stack_fffffffffffffc57,
                          CONCAT16(in_stack_fffffffffffffc56,
                                   CONCAT24(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50))),
                 (QList<QVariant> *)CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48));
      QList<int>::~QList((QList<int> *)0x116301);
      QList<QVariant>::~QList((QList<QVariant> *)0x11630e);
    }
    if (bVar10) {
      for (local_294 = 0; local_294 < iVar3; local_294 = local_294 + 1) {
        pQVar8 = QList<QVariant>::at((QList<QVariant> *)
                                     CONCAT17(in_stack_fffffffffffffc57,
                                              CONCAT16(in_stack_fffffffffffffc56,
                                                       CONCAT24(in_stack_fffffffffffffc54,
                                                                in_stack_fffffffffffffc50))),
                                     CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48));
        uVar9 = QSqlResultPrivate::isVariantNull((QVariant *)pQVar8);
        if ((uVar9 & 1) == 0) {
          iVar4 = QVariant::userType((QVariant *)0x1163bf);
          switch(iVar4) {
          case 1:
          case 2:
            in_stack_fffffffffffffcf0 = (QSQLiteResultPrivate *)pQVar5->stmt;
            QVariant::toInt((bool *)pQVar8);
            local_250 = sqlite3_bind_int((sqlite3_stmt *)
                                         CONCAT17(in_stack_fffffffffffffc57,
                                                  CONCAT16(in_stack_fffffffffffffc56,
                                                           CONCAT24(in_stack_fffffffffffffc54,
                                                                    in_stack_fffffffffffffc50))),
                                         in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48);
            break;
          case 3:
          case 4:
            QVariant::toLongLong((bool *)pQVar8);
            local_250 = sqlite3_bind_int64((sqlite3_stmt *)in_stack_fffffffffffffc60,
                                           (int)((ulong)in_stack_fffffffffffffc58 >> 0x20),
                                           CONCAT17(in_stack_fffffffffffffc57,
                                                    CONCAT16(in_stack_fffffffffffffc56,
                                                             CONCAT24(in_stack_fffffffffffffc54,
                                                                      in_stack_fffffffffffffc50))));
            break;
          default:
            local_180.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
            local_180.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
            local_180.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
            QVariant::toString();
            in_stack_fffffffffffffc60 = (QStringView *)pQVar5->stmt;
            in_stack_fffffffffffffc70 =
                 QString::data((QString *)
                               CONCAT17(in_stack_fffffffffffffc57,
                                        CONCAT16(in_stack_fffffffffffffc56,
                                                 CONCAT24(in_stack_fffffffffffffc54,
                                                          in_stack_fffffffffffffc50))));
            QString::size(&local_180);
            local_250 = sqlite3_bind_text16((sqlite3_stmt *)in_stack_fffffffffffffc60,
                                            (int)((ulong)in_stack_fffffffffffffc58 >> 0x20),
                                            (void *)CONCAT17(in_stack_fffffffffffffc57,
                                                             CONCAT16(in_stack_fffffffffffffc56,
                                                                      CONCAT24(
                                                  in_stack_fffffffffffffc54,
                                                  in_stack_fffffffffffffc50))),
                                            in_stack_fffffffffffffc4c,
                                            (_func_void_void_ptr *)0x11698e);
            QString::~QString((QString *)0x1169ad);
            break;
          case 6:
            in_stack_fffffffffffffce0 = pQVar5->stmt;
            in_stack_fffffffffffffcec = local_294 + 1;
            QVariant::toDouble((bool *)pQVar8);
            local_250 = sqlite3_bind_double((sqlite3_stmt *)in_stack_fffffffffffffc60,
                                            (int)((ulong)in_stack_fffffffffffffc58 >> 0x20),
                                            (double)CONCAT17(in_stack_fffffffffffffc57,
                                                             CONCAT16(in_stack_fffffffffffffc56,
                                                                      CONCAT24(
                                                  in_stack_fffffffffffffc54,
                                                  in_stack_fffffffffffffc50))));
            break;
          case 10:
            this_01 = (QString *)QVariant::constData((QVariant *)0x116876);
            in_stack_fffffffffffffc78 = pQVar5->stmt;
            in_stack_fffffffffffffc84 = local_294 + 1;
            QString::unicode((QString *)0x1168ad);
            QString::size(this_01);
            local_250 = sqlite3_bind_text16((sqlite3_stmt *)in_stack_fffffffffffffc60,
                                            (int)((ulong)in_stack_fffffffffffffc58 >> 0x20),
                                            (void *)CONCAT17(in_stack_fffffffffffffc57,
                                                             CONCAT16(in_stack_fffffffffffffc56,
                                                                      CONCAT24(
                                                  in_stack_fffffffffffffc54,
                                                  in_stack_fffffffffffffc50))),
                                            in_stack_fffffffffffffc4c,
                                            (_func_void_void_ptr *)0x1168de);
            break;
          case 0xc:
            this_00 = (QByteArray *)QVariant::constData((QVariant *)0x1163fa);
            QByteArray::constData((QByteArray *)0x116437);
            QByteArray::size(this_00);
            local_250 = sqlite3_bind_blob((sqlite3_stmt *)in_stack_fffffffffffffc60,
                                          (int)((ulong)in_stack_fffffffffffffc58 >> 0x20),
                                          (void *)CONCAT17(in_stack_fffffffffffffc57,
                                                           CONCAT16(in_stack_fffffffffffffc56,
                                                                    CONCAT24(
                                                  in_stack_fffffffffffffc54,
                                                  in_stack_fffffffffffffc50))),
                                          in_stack_fffffffffffffc4c,(_func_void_void_ptr *)0x11646f)
            ;
            break;
          case 0xf:
            local_13c = 0xaaaaaaaa;
            local_13c = QVariant::toTime();
            local_158.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
            local_158.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
            local_158.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
            std::data<char16_t_const,13ul>((char16_t (*) [13])L"hh:mm:ss.zzz");
            for (local_210 = 0; (local_210 < 0xd && (L"hh:mm:ss.zzz"[local_210] != L'\0'));
                local_210 = local_210 + 1) {
            }
            QStringView::QStringView<char16_t,_true>
                      (in_stack_fffffffffffffc60,(char16_t *)in_stack_fffffffffffffc58,
                       CONCAT17(in_stack_fffffffffffffc57,
                                CONCAT16(in_stack_fffffffffffffc56,
                                         CONCAT24(in_stack_fffffffffffffc54,
                                                  in_stack_fffffffffffffc50))));
            QTime::toString((QStringView *)&local_158);
            QString::data((QString *)
                          CONCAT17(in_stack_fffffffffffffc57,
                                   CONCAT16(in_stack_fffffffffffffc56,
                                            CONCAT24(in_stack_fffffffffffffc54,
                                                     in_stack_fffffffffffffc50))));
            QString::size(&local_158);
            local_250 = sqlite3_bind_text16((sqlite3_stmt *)in_stack_fffffffffffffc60,
                                            (int)((ulong)in_stack_fffffffffffffc58 >> 0x20),
                                            (void *)CONCAT17(in_stack_fffffffffffffc57,
                                                             CONCAT16(in_stack_fffffffffffffc56,
                                                                      CONCAT24(
                                                  in_stack_fffffffffffffc54,
                                                  in_stack_fffffffffffffc50))),
                                            in_stack_fffffffffffffc4c,
                                            (_func_void_void_ptr *)0x116845);
            QString::~QString((QString *)0x116864);
            break;
          case 0x10:
            local_120[0] = &DAT_aaaaaaaaaaaaaaaa;
            QVariant::toDateTime();
            local_138.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
            local_138.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
            local_138.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
            QDateTime::toString((DateFormat)&local_138);
            QString::data((QString *)
                          CONCAT17(in_stack_fffffffffffffc57,
                                   CONCAT16(in_stack_fffffffffffffc56,
                                            CONCAT24(in_stack_fffffffffffffc54,
                                                     in_stack_fffffffffffffc50))));
            QString::size(&local_138);
            local_250 = sqlite3_bind_text16((sqlite3_stmt *)in_stack_fffffffffffffc60,
                                            (int)((ulong)in_stack_fffffffffffffc58 >> 0x20),
                                            (void *)CONCAT17(in_stack_fffffffffffffc57,
                                                             CONCAT16(in_stack_fffffffffffffc56,
                                                                      CONCAT24(
                                                  in_stack_fffffffffffffc54,
                                                  in_stack_fffffffffffffc50))),
                                            in_stack_fffffffffffffc4c,
                                            (_func_void_void_ptr *)0x11665c);
            QString::~QString((QString *)0x11667b);
            QDateTime::~QDateTime((QDateTime *)local_120);
          }
        }
        else {
          local_250 = sqlite3_bind_null((sqlite3_stmt *)
                                        CONCAT17(in_stack_fffffffffffffc57,
                                                 CONCAT16(in_stack_fffffffffffffc56,
                                                          CONCAT24(in_stack_fffffffffffffc54,
                                                                   in_stack_fffffffffffffc50))),
                                        in_stack_fffffffffffffc4c);
        }
        if (local_250 != 0) {
          QSQLiteResultPrivate::drv_d_func
                    ((QSQLiteResultPrivate *)
                     CONCAT17(in_stack_fffffffffffffc57,
                              CONCAT16(in_stack_fffffffffffffc56,
                                       CONCAT24(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50)
                                      )));
          QCoreApplication::translate(local_1a0,"QSQLiteResult","Unable to bind parameters",0);
          qMakeError((sqlite3 *)CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80),
                     (QString *)in_stack_fffffffffffffc78,
                     (ErrorType)((ulong)in_stack_fffffffffffffc70 >> 0x20),
                     (int)in_stack_fffffffffffffc70);
          (**(code **)(*in_RDI + 0x28))(in_RDI,local_188);
          QSqlError::~QSqlError(local_188);
          QString::~QString((QString *)0x116a52);
          QSQLiteResultPrivate::finalize
                    ((QSQLiteResultPrivate *)
                     CONCAT17(in_stack_fffffffffffffc57,
                              CONCAT16(in_stack_fffffffffffffc56,
                                       CONCAT24(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50)
                                      )));
          local_231 = false;
          goto LAB_00116c5d;
        }
      }
      bVar10 = QSQLiteResultPrivate::fetchNext
                         (in_stack_fffffffffffffcf0,
                          (ValueCache *)
                          CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8),
                          (int)((ulong)in_stack_fffffffffffffce0 >> 0x20),
                          SUB81((ulong)in_stack_fffffffffffffce0 >> 0x18,0));
      pQVar5->skippedStatus = bVar10;
      QSqlResult::lastError();
      bVar2 = QSqlError::isValid();
      QSqlError::~QSqlError(local_1f8);
      if ((bVar2 & 1) == 0) {
        bVar2 = QSqlRecord::isEmpty();
        (**(code **)(*in_RDI + 0x38))(in_RDI,(bVar2 ^ 0xff) & 1);
        (**(code **)(*in_RDI + 0x20))(in_RDI,1);
        local_231 = true;
      }
      else {
        (**(code **)(*in_RDI + 0x38))(in_RDI,0);
        (**(code **)(*in_RDI + 0x20))(in_RDI,0);
        local_231 = false;
      }
    }
    else {
      QCoreApplication::translate(local_1c0,"QSQLiteResult","Parameter count mismatch",0);
      QString::QString((QString *)0x116ac6);
      QString::QString((QString *)0x116ad3);
      QSqlError::QSqlError
                (local_1a8,(QString *)local_1c0,(QString *)local_1d8,StatementError,
                 (QString *)local_1f0);
      (**(code **)(*in_RDI + 0x28))(in_RDI,local_1a8);
      QSqlError::~QSqlError(local_1a8);
      QString::~QString((QString *)0x116b2d);
      QString::~QString((QString *)0x116b3a);
      QString::~QString((QString *)0x116b47);
      local_231 = false;
    }
  }
  else {
    QSQLiteResultPrivate::drv_d_func
              ((QSQLiteResultPrivate *)
               CONCAT17(in_stack_fffffffffffffc57,
                        CONCAT16(in_stack_fffffffffffffc56,
                                 CONCAT24(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50))));
    QCoreApplication::translate(local_90,"QSQLiteResult","Unable to reset statement",0);
    qMakeError((sqlite3 *)CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80),
               (QString *)in_stack_fffffffffffffc78,
               (ErrorType)((ulong)in_stack_fffffffffffffc70 >> 0x20),(int)in_stack_fffffffffffffc70)
    ;
    (**(code **)(*in_RDI + 0x28))(in_RDI,local_78);
    QSqlError::~QSqlError(local_78);
    QString::~QString((QString *)0x115f36);
    QSQLiteResultPrivate::finalize
              ((QSQLiteResultPrivate *)
               CONCAT17(in_stack_fffffffffffffc57,
                        CONCAT16(in_stack_fffffffffffffc56,
                                 CONCAT24(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50))));
    local_231 = false;
  }
LAB_00116c5d:
  QList<QVariant>::~QList((QList<QVariant> *)0x116c6a);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_231;
  }
  __stack_chk_fail();
}

Assistant:

bool QSQLiteResult::exec()
{
    Q_D(QSQLiteResult);
    QList<QVariant> values = boundValues();

    d->skippedStatus = false;
    d->skipRow = false;
    d->rInf.clear();
    clearValues();
    setLastError(QSqlError());

    int res = sqlite3_reset(d->stmt);
    if (res != SQLITE_OK) {
        setLastError(qMakeError(d->drv_d_func()->access, QCoreApplication::translate("QSQLiteResult",
                     "Unable to reset statement"), QSqlError::StatementError, res));
        d->finalize();
        return false;
    }

    int paramCount = sqlite3_bind_parameter_count(d->stmt);
    bool paramCountIsValid = paramCount == values.size();

#if (SQLITE_VERSION_NUMBER >= 3003011)
    // In the case of the reuse of a named placeholder
    // We need to check explicitly that paramCount is greater than or equal to 1, as sqlite
    // can end up in a case where for virtual tables it returns 0 even though it
    // has parameters
    if (paramCount >= 1 && paramCount < values.size()) {
        const auto countIndexes = [](int counter, const QList<int> &indexList) {
                                      return counter + indexList.size();
                                  };

        const int bindParamCount = std::accumulate(d->indexes.cbegin(),
                                                   d->indexes.cend(),
                                                   0,
                                                   countIndexes);

        paramCountIsValid = bindParamCount == values.size();
        // When using named placeholders, it will reuse the index for duplicated
        // placeholders. So we need to ensure the QList has only one instance of
        // each value as SQLite will do the rest for us.
        QList<QVariant> prunedValues;
        QList<int> handledIndexes;
        for (int i = 0, currentIndex = 0; i < values.size(); ++i) {
            if (handledIndexes.contains(i))
                continue;
            const char *parameterName = sqlite3_bind_parameter_name(d->stmt, currentIndex + 1);
            if (!parameterName) {
                paramCountIsValid = false;
                continue;
            }
            const auto placeHolder = QString::fromUtf8(parameterName);
            const auto &indexes = d->indexes.value(placeHolder);
            handledIndexes << indexes;
            prunedValues << values.at(indexes.first());
            ++currentIndex;
        }
        values = prunedValues;
    }
#endif

    if (paramCountIsValid) {
        for (int i = 0; i < paramCount; ++i) {
            res = SQLITE_OK;
            const QVariant &value = values.at(i);

            if (QSqlResultPrivate::isVariantNull(value)) {
                res = sqlite3_bind_null(d->stmt, i + 1);
            } else {
                switch (value.userType()) {
                case QMetaType::QByteArray: {
                    const QByteArray *ba = static_cast<const QByteArray*>(value.constData());
                    res = sqlite3_bind_blob(d->stmt, i + 1, ba->constData(),
                                            ba->size(), SQLITE_STATIC);
                    break; }
                case QMetaType::Int:
                case QMetaType::Bool:
                    res = sqlite3_bind_int(d->stmt, i + 1, value.toInt());
                    break;
                case QMetaType::Double:
                    res = sqlite3_bind_double(d->stmt, i + 1, value.toDouble());
                    break;
                case QMetaType::UInt:
                case QMetaType::LongLong:
                    res = sqlite3_bind_int64(d->stmt, i + 1, value.toLongLong());
                    break;
                case QMetaType::QDateTime: {
                    const QDateTime dateTime = value.toDateTime();
                    const QString str = dateTime.toString(Qt::ISODateWithMs);
                    res = sqlite3_bind_text16(d->stmt, i + 1, str.data(),
                                              int(str.size() * sizeof(ushort)),
                                              SQLITE_TRANSIENT);
                    break;
                }
                case QMetaType::QTime: {
                    const QTime time = value.toTime();
                    const QString str = time.toString(u"hh:mm:ss.zzz");
                    res = sqlite3_bind_text16(d->stmt, i + 1, str.data(),
                                              int(str.size() * sizeof(ushort)),
                                              SQLITE_TRANSIENT);
                    break;
                }
                case QMetaType::QString: {
                    // lifetime of string == lifetime of its qvariant
                    const QString *str = static_cast<const QString*>(value.constData());
                    res = sqlite3_bind_text16(d->stmt, i + 1, str->unicode(),
                                              int(str->size()) * sizeof(QChar),
                                              SQLITE_STATIC);
                    break; }
                default: {
                    const QString str = value.toString();
                    // SQLITE_TRANSIENT makes sure that sqlite buffers the data
                    res = sqlite3_bind_text16(d->stmt, i + 1, str.data(),
                                              int(str.size()) * sizeof(QChar),
                                              SQLITE_TRANSIENT);
                    break; }
                }
            }
            if (res != SQLITE_OK) {
                setLastError(qMakeError(d->drv_d_func()->access, QCoreApplication::translate("QSQLiteResult",
                             "Unable to bind parameters"), QSqlError::StatementError, res));
                d->finalize();
                return false;
            }
        }
    } else {
        setLastError(QSqlError(QCoreApplication::translate("QSQLiteResult",
                        "Parameter count mismatch"), QString(), QSqlError::StatementError));
        return false;
    }
    d->skippedStatus = d->fetchNext(d->firstRow, 0, true);
    if (lastError().isValid()) {
        setSelect(false);
        setActive(false);
        return false;
    }
    setSelect(!d->rInf.isEmpty());
    setActive(true);
    return true;
}